

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawNegativeViewportHeightTests.cpp
# Opt level: O0

ConstPixelBufferAccess * __thiscall
vkt::Draw::anon_unknown_0::NegativeViewportHeightTestInstance::draw
          (ConstPixelBufferAccess *__return_storage_ptr__,NegativeViewportHeightTestInstance *this,
          VkViewport viewport)

{
  VkAllocationCallbacks **pCreateInfo;
  VkCommandBuffer cmdBuffer_00;
  VkCommandBuffer_s *pVVar1;
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  RefData<vk::Handle<(vk::HandleType)6>_> data_01;
  VkRect2D _renderArea;
  deUint32 _queueFamilyIndex;
  VkResult VVar2;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Handle<(vk::HandleType)24> *pHVar3;
  VkCommandBuffer_s **ppVVar4;
  Image *pIVar5;
  VkImage VVar6;
  Handle<(vk::HandleType)17> *pHVar7;
  Handle<(vk::HandleType)23> *pHVar8;
  Buffer *this_00;
  Handle<(vk::HandleType)18> *pHVar9;
  Handle<(vk::HandleType)6> *pHVar10;
  Allocator *allocator;
  VkClearValue VVar11;
  VkOffset3D zeroOffset;
  undefined8 uStack_318;
  VkSubmitInfo submitInfo;
  RefData<vk::Handle<(vk::HandleType)6>_> local_2b0;
  undefined1 local_290 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> fence;
  deUint64 local_268;
  VkBuffer buffer;
  VkDeviceSize offset;
  pointer pVStack_250;
  pointer local_248;
  VkOffset2D local_238;
  VkExtent2D VStack_230;
  VkFramebuffer local_220;
  VkRenderPass local_218;
  undefined1 local_210 [8];
  RenderPassBeginInfo renderPassBegin;
  VkRect2D renderArea;
  VkMemoryBarrier memBarrier;
  undefined1 local_17c [8];
  ImageSubresourceRange subresourceRange;
  VkClearDepthStencilValue VStack_158;
  VkClearColorValue clearColor;
  CmdBufferBeginInfo beginInfo;
  Move<vk::VkCommandBuffer_s_*> local_120;
  RefData<vk::VkCommandBuffer_s_*> local_100;
  undefined1 local_e0 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  Move<vk::Handle<(vk::HandleType)24>_> local_b0;
  RefData<vk::Handle<(vk::HandleType)24>_> local_90;
  undefined1 local_70 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  NegativeViewportHeightTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  _queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  pCreateInfo = &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  CmdPoolCreateInfo::CmdPoolCreateInfo((CmdPoolCreateInfo *)pCreateInfo,_queueFamilyIndex,2);
  ::vk::createCommandPool
            (&local_b0,vk_00,device_00,(VkCommandPoolCreateInfo *)pCreateInfo,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_90,(Move *)&local_b0);
  data.deleter.m_deviceIface._0_4_ = (int)local_90.deleter.m_deviceIface;
  data.object.m_internal = local_90.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_90.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_90.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_90.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_90.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_90.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_70,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_b0);
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_70);
  beginInfo.super_VkCommandBufferBeginInfo.pInheritanceInfo =
       (VkCommandBufferInheritanceInfo *)pHVar3->m_internal;
  ::vk::allocateCommandBuffer
            (&local_120,vk_00,device_00,
             (VkCommandPool)beginInfo.super_VkCommandBufferBeginInfo.pInheritanceInfo,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_100,(Move *)&local_120);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_100.deleter.m_deviceIface;
  data_00.object = local_100.object;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_100.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_100.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_100.deleter.m_device >> 0x20);
  data_00.deleter.m_pool.m_internal._0_4_ = (int)local_100.deleter.m_pool.m_internal;
  data_00.deleter.m_pool.m_internal._4_4_ = (int)(local_100.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_e0,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_120);
  CmdBufferBeginInfo::CmdBufferBeginInfo((CmdBufferBeginInfo *)(clearColor.float32 + 2),0);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_e0);
  (*vk_00->_vptr_DeviceInterface[0x49])(vk_00,*ppVVar4,clearColor.float32 + 2);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_e0);
  (*vk_00->_vptr_DeviceInterface[0x4d])(vk_00,*ppVVar4,0,1);
  VVar11 = ::vk::makeClearValueColorF32(0.0,0.0,0.0,1.0);
  clearColor._0_8_ = VVar11._8_8_;
  subresourceRange.super_VkImageSubresourceRange._12_8_ = VVar11.depthStencil;
  VStack_158 = (VkClearDepthStencilValue)subresourceRange.super_VkImageSubresourceRange._12_8_;
  ImageSubresourceRange::ImageSubresourceRange((ImageSubresourceRange *)local_17c,1,0,1,0,1);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_e0);
  cmdBuffer_00 = *ppVVar4;
  pIVar5 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_colorTargetImage);
  VVar6 = Draw::Image::object(pIVar5);
  initialTransitionColor2DImage(vk_00,cmdBuffer_00,VVar6,VK_IMAGE_LAYOUT_GENERAL);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_e0);
  pVVar1 = *ppVVar4;
  pIVar5 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_colorTargetImage);
  VVar6 = Draw::Image::object(pIVar5);
  (*vk_00->_vptr_DeviceInterface[0x66])(vk_00,pVVar1,VVar6.m_internal,1,&VStack_158,1,local_17c);
  renderArea.extent.width = 0x2e;
  renderArea.extent.height = 0;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_e0);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar4,0x1000,0x400,0,1,&renderArea.extent,0,0,0,0);
  renderPassBegin.m_clearValues.
  super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  renderArea.offset.x = 0x100;
  renderArea.offset.y = 0x80;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_218.m_internal = pHVar7->m_internal;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                     (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  local_220.m_internal = pHVar8->m_internal;
  local_238 = (VkOffset2D)
              renderPassBegin.m_clearValues.
              super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  VStack_230.width = renderArea.offset.x;
  VStack_230.height = renderArea.offset.y;
  offset = 0;
  pVStack_250 = (pointer)0x0;
  local_248 = (pointer)0x0;
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
            ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)&offset);
  _renderArea.extent = VStack_230;
  _renderArea.offset = local_238;
  RenderPassBeginInfo::RenderPassBeginInfo
            ((RenderPassBeginInfo *)local_210,local_218,local_220,_renderArea,
             (vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)&offset);
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::~vector
            ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)&offset);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_e0);
  (*vk_00->_vptr_DeviceInterface[0x74])(vk_00,*ppVVar4,local_210,0);
  RenderPassBeginInfo::~RenderPassBeginInfo((RenderPassBeginInfo *)local_210);
  buffer.m_internal = 0;
  this_00 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_vertexBuffer);
  local_268 = (deUint64)Draw::Buffer::object(this_00);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_e0);
  (*vk_00->_vptr_DeviceInterface[0x58])(vk_00,*ppVVar4,0,1,&local_268,&buffer);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_e0);
  pVVar1 = *ppVVar4;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar9->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x4c])
            (vk_00,pVVar1,0,
             fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_e0);
  (*vk_00->_vptr_DeviceInterface[0x59])(vk_00,*ppVVar4,6,1,0);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_e0);
  (*vk_00->_vptr_DeviceInterface[0x76])(vk_00,*ppVVar4);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_e0);
  (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar4);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo.pSignalSemaphores,vk_00,
                    device_00,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2b0,(Move *)&submitInfo.pSignalSemaphores)
  ;
  data_01.deleter.m_deviceIface._0_4_ = (int)local_2b0.deleter.m_deviceIface;
  data_01.object.m_internal = local_2b0.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2b0.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_2b0.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_2b0.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_2b0.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_2b0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_290,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo.pSignalSemaphores);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_318 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_e0);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_290);
  VVar2 = (*vk_00->_vptr_DeviceInterface[2])(vk_00,queue_00,1,&uStack_318,pHVar10->m_internal);
  ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawNegativeViewportHeightTests.cpp"
                    ,0x13a);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_290);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device_00,1,pHVar10,1,0xffffffffffffffff);
  ::vk::checkResult(VVar2,"vk.waitForFences(device, 1u, &fence.get(), VK_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawNegativeViewportHeightTests.cpp"
                    ,0x13b);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_290);
  pIVar5 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_colorTargetImage);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  Draw::Image::readSurface
            (__return_storage_ptr__,pIVar5,queue_00,allocator,VK_IMAGE_LAYOUT_GENERAL,
             (VkOffset3D)ZEXT812(0),0x100,0x80,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_e0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_70);
  return __return_storage_ptr__;
}

Assistant:

tcu::ConstPixelBufferAccess NegativeViewportHeightTestInstance::draw (const VkViewport viewport)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	// Command buffer

	const CmdPoolCreateInfo			cmdPoolCreateInfo	(queueFamilyIndex);
	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, &cmdPoolCreateInfo));
	const Unique<VkCommandBuffer>	cmdBuffer			(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Draw

	{
		const CmdBufferBeginInfo beginInfo;
		vk.beginCommandBuffer(*cmdBuffer, &beginInfo);
	}

	vk.cmdSetViewport(*cmdBuffer, 0u, 1u, &viewport);

	{
		const VkClearColorValue		clearColor			= makeClearValueColorF32(0.0f, 0.0f, 0.0f, 1.0f).color;
		const ImageSubresourceRange subresourceRange	(VK_IMAGE_ASPECT_COLOR_BIT);

		initialTransitionColor2DImage(vk, *cmdBuffer, m_colorTargetImage->object(), VK_IMAGE_LAYOUT_GENERAL);
		vk.cmdClearColorImage(*cmdBuffer, m_colorTargetImage->object(), VK_IMAGE_LAYOUT_GENERAL, &clearColor, 1, &subresourceRange);
	}
	{
		const VkMemoryBarrier memBarrier =
		{
			VK_STRUCTURE_TYPE_MEMORY_BARRIER,												// VkStructureType    sType;
			DE_NULL,																		// const void*        pNext;
			VK_ACCESS_TRANSFER_WRITE_BIT,													// VkAccessFlags      srcAccessMask;
			VK_ACCESS_COLOR_ATTACHMENT_READ_BIT | VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT		// VkAccessFlags      dstAccessMask;
		};

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, 0, 1, &memBarrier, 0, DE_NULL, 0, DE_NULL);
	}
	{
		const VkRect2D				renderArea		= { { 0, 0 }, { WIDTH, HEIGHT } };
		const RenderPassBeginInfo	renderPassBegin	(*m_renderPass, *m_framebuffer, renderArea);

		vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBegin, VK_SUBPASS_CONTENTS_INLINE);
	}
	{
		const VkDeviceSize	offset	= 0;
		const VkBuffer		buffer	= m_vertexBuffer->object();

		vk.cmdBindVertexBuffers(*cmdBuffer, 0, 1, &buffer, &offset);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
	vk.cmdDraw(*cmdBuffer, 6, 1, 0, 0);
	vk.cmdEndRenderPass(*cmdBuffer);
	vk.endCommandBuffer(*cmdBuffer);

	// Submit
	{
		const Unique<VkFence>	fence		(createFence(vk, device));
		const VkSubmitInfo		submitInfo	=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,				// VkStructureType                sType;
			DE_NULL,									// const void*                    pNext;
			0,											// uint32_t                       waitSemaphoreCount;
			DE_NULL,									// const VkSemaphore*             pWaitSemaphores;
			(const VkPipelineStageFlags*)DE_NULL,		// const VkPipelineStageFlags*    pWaitDstStageMask;
			1,											// uint32_t                       commandBufferCount;
			&cmdBuffer.get(),							// const VkCommandBuffer*         pCommandBuffers;
			0,											// uint32_t                       signalSemaphoreCount;
			DE_NULL										// const VkSemaphore*             pSignalSemaphores;
		};

		VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *fence));
		VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), VK_TRUE, ~0ull));
	}

	// Get result
	{
		const VkOffset3D zeroOffset = { 0, 0, 0 };
		return m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(), VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, VK_IMAGE_ASPECT_COLOR_BIT);
	}
}